

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase268::run(TestCase268 *this)

{
  undefined8 *puVar1;
  undefined1 *puVar2;
  Iface *pIVar3;
  undefined8 uVar4;
  ThreadState *firstElement;
  Thread *this_00;
  long lVar5;
  Own<kj::Thread,_std::nullptr_t> *ptrCopy;
  long lVar6;
  int iVar7;
  DebugExpression<bool> _kjCondition_10;
  MutexGuarded<unsigned_int> value;
  uint m;
  Thread thread_1;
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  uint m_3;
  uint m_1;
  Thread thread;
  Iface local_5f1 [3];
  int local_5d8 [3];
  undefined1 local_5ca;
  undefined1 local_5c9;
  MonotonicClock *local_5c8;
  Disposer local_5c0;
  Disposer *local_5b8;
  Disposer *local_5b0;
  Function<void_()> local_5a8;
  Function<void_()> local_598;
  Function<void_()> local_588;
  Thread local_578;
  undefined1 local_560 [16];
  Disposer *local_550;
  undefined1 *local_548;
  bool local_540;
  Disposer local_3c8 [2];
  Disposer local_3b8;
  long local_3b0;
  Disposer *local_3a8;
  Mutex *local_3a0;
  Disposer *local_398;
  Mutex *local_390;
  Disposer *local_388;
  undefined1 local_380 [24];
  undefined8 *local_368;
  Mutex *local_1e8;
  Disposer *local_1e0;
  undefined1 local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined8 local_38;
  
  local_5c8 = systemPreciseMonotonicClock();
  puVar2 = (undefined1 *)((long)&local_5f1[0]._vptr_Iface + 1);
  _::Mutex::Mutex((Mutex *)puVar2);
  local_5d8[0] = 0x7b;
  local_560._0_8_ = local_560._0_8_ & 0xffffffffffffff00;
  _::Mutex::lock((Mutex *)puVar2,0);
  local_380._8_8_ = 10000000000;
  local_560._0_8_ = &PTR_check_00226128;
  local_380[0] = 1;
  local_560._8_8_ = &local_3b8;
  local_550 = (Disposer *)local_5d8;
  local_1e8 = (Mutex *)puVar2;
  local_1e0 = (Disposer *)local_5d8;
  _::Mutex::wait((Mutex *)puVar2,local_560);
  iVar7 = local_5d8[0];
  local_5d8[0] = local_5d8[0] + 1;
  _::Mutex::unlock((Mutex *)((long)&local_5f1[0]._vptr_Iface + 1),EXCLUSIVE,(Waiter *)0x0);
  local_560._0_8_ = &local_5c0;
  local_5c0._vptr_Disposer._0_4_ = iVar7 + 3;
  local_560._8_4_ = 0x7e;
  local_550 = (Disposer *)0x1c31cf;
  local_548 = &DAT_00000005;
  local_540 = iVar7 + 3 == 0x7e;
  if ((!local_540) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x118,ERROR,"\"failed: expected \" \"m == 126\", _kjCondition",
               (char (*) [26])"failed: expected m == 126",
               (DebugComparison<unsigned_int_&,_int> *)local_560);
  }
  local_380._0_8_ = local_380._0_8_ & 0xffffffffffffff00;
  _::Mutex::lock((Mutex *)((long)&local_5f1[0]._vptr_Iface + 1),1);
  puVar2 = (undefined1 *)((long)&local_5f1[0]._vptr_Iface + 1);
  local_540 = local_5d8[0] == 0x7c;
  local_560._8_4_ = 0x7c;
  local_550 = (Disposer *)0x1c31cf;
  local_548 = &DAT_00000005;
  local_560._0_8_ = local_5d8;
  _::Mutex::unlock((Mutex *)puVar2,SHARED,(Waiter *)0x0);
  if ((local_540 == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[44],kj::_::DebugComparison<unsigned_int_const&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x11a,ERROR,"\"failed: expected \" \"*value.lockShared() == 124\", _kjCondition",
               (char (*) [44])"failed: expected *value.lockShared() == 124",
               (DebugComparison<const_unsigned_int_&,_int> *)local_560);
  }
  local_588.impl.ptr = (Iface *)operator_new(0x10);
  (local_588.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00226158;
  local_588.impl.ptr[1] = (Iface)puVar2;
  local_588.impl.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::TestCase268::run()::$_2>>
        ::instance;
  Thread::Thread((Thread *)local_380,&local_588);
  pIVar3 = local_588.impl.ptr;
  if (local_588.impl.ptr != (Iface *)0x0) {
    local_588.impl.ptr = (Iface *)0x0;
    (**(local_588.impl.disposer)->_vptr_Disposer)
              (local_588.impl.disposer,
               (_func_int *)((long)&pIVar3->_vptr_Iface + (long)pIVar3->_vptr_Iface[-2]));
  }
  local_560._0_8_ = local_560._0_8_ & 0xffffffffffffff00;
  puVar2 = (undefined1 *)((long)&local_5f1[0]._vptr_Iface + 1);
  _::Mutex::lock((Mutex *)puVar2,0);
  local_1e0 = (Disposer *)0x2540be400;
  local_560._0_8_ = &PTR_check_002261c0;
  local_560._8_8_ = &local_578;
  local_1e8 = (Mutex *)CONCAT71(local_1e8._1_7_,1);
  local_5c0._vptr_Disposer = (_func_int **)puVar2;
  local_5b8 = (Disposer *)local_5d8;
  local_550 = (Disposer *)local_5d8;
  _::Mutex::wait((Mutex *)puVar2,local_560);
  iVar7 = local_5d8[0];
  local_5d8[0] = local_5d8[0] + 1;
  _::Mutex::unlock((Mutex *)((long)&local_5f1[0]._vptr_Iface + 1),EXCLUSIVE,(Waiter *)0x0);
  local_3b8._vptr_Disposer._0_4_ = iVar7 + 3;
  local_560._8_4_ = 0x144;
  local_550 = (Disposer *)0x1c31cf;
  local_548 = &DAT_00000005;
  local_540 = iVar7 + 3 == 0x144;
  local_560._0_8_ = &local_3b8;
  if ((!local_540) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x127,ERROR,"\"failed: expected \" \"m == 324\", _kjCondition",
               (char (*) [26])"failed: expected m == 324",
               (DebugComparison<unsigned_int_&,_int> *)local_560);
  }
  local_1e8 = (Mutex *)((ulong)local_1e8 & 0xffffffffffffff00);
  _::Mutex::lock((Mutex *)((long)&local_5f1[0]._vptr_Iface + 1),1);
  local_540 = local_5d8[0] == 0x142;
  local_560._8_4_ = 0x142;
  local_550 = (Disposer *)0x1c31cf;
  local_548 = &DAT_00000005;
  local_560._0_8_ = local_5d8;
  _::Mutex::unlock((Mutex *)((long)&local_5f1[0]._vptr_Iface + 1),SHARED,(Waiter *)0x0);
  if ((local_540 == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[44],kj::_::DebugComparison<unsigned_int_const&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x129,ERROR,"\"failed: expected \" \"*value.lockShared() == 322\", _kjCondition",
               (char (*) [44])"failed: expected *value.lockShared() == 322",
               (DebugComparison<const_unsigned_int_&,_int> *)local_560);
  }
  Thread::~Thread((Thread *)local_380);
  local_560._0_8_ = local_560._0_8_ & 0xffffffffffffff00;
  _::Mutex::lock((Mutex *)((long)&local_5f1[0]._vptr_Iface + 1));
  local_5d8[0] = 0;
  _::Mutex::unlock((Mutex *)((long)&local_5f1[0]._vptr_Iface + 1),EXCLUSIVE,(Waiter *)0x0);
  iVar7 = 0;
  firstElement = (ThreadState *)
                 _::HeapArrayDisposer::allocateImpl
                           (0x10,0,100,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_380._16_8_ = (long)&firstElement[3].exception.ptr.field_1 + 0xd8;
  local_368 = &_::HeapArrayDisposer::instance;
  lVar6 = 0;
  local_380._0_8_ = firstElement;
  local_380._8_8_ = firstElement;
  do {
    this_00 = (Thread *)operator_new(0x18);
    local_560._8_8_ = operator_new(0x18);
    ((Iface *)local_560._8_8_)->_vptr_Iface = (_func_int **)&PTR_operator___002261f0;
    *(int *)&((Iface *)(local_560._8_8_ + 8))->_vptr_Iface = iVar7;
    ((Iface *)(local_560._8_8_ + 0x10))->_vptr_Iface =
         (_func_int **)((long)&local_5f1[0]._vptr_Iface + 1);
    local_560._0_8_ =
         &_::
          HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::TestCase268::run()::$_5>>
          ::instance;
    Thread::Thread(this_00,(Function<void_()> *)local_560);
    uVar4 = local_560._8_8_;
    if ((Iface *)local_560._8_8_ != (Iface *)0x0) {
      local_560._8_8_ = (Iface *)0x0;
      (***(_func_int ***)local_560._0_8_)(local_560._0_8_,(*(_func_int ***)uVar4)[-2] + uVar4);
    }
    puVar1 = (undefined8 *)((long)&(firstElement->func).impl.disposer + lVar6);
    *puVar1 = &_::HeapDisposer<kj::Thread>::instance;
    puVar1[1] = this_00;
    local_380._8_8_ = puVar1 + 2;
    iVar7 = iVar7 + 1;
    lVar6 = lVar6 + 0x10;
  } while (iVar7 != 100);
  local_560._0_8_ = local_560._0_8_ & 0xffffffffffffff00;
  puVar2 = (undefined1 *)((long)&local_5f1[0]._vptr_Iface + 1);
  _::Mutex::lock((Mutex *)puVar2,0);
  local_5b8 = (Disposer *)local_5d8;
  local_1e0 = (Disposer *)0x2540be400;
  local_560._0_8_ = &PTR_check_00226288;
  local_560._8_8_ = &local_578;
  local_1e8 = (Mutex *)CONCAT71(local_1e8._1_7_,1);
  local_5c0._vptr_Disposer = (_func_int **)puVar2;
  local_550 = local_5b8;
  _::Mutex::wait((Mutex *)puVar2,local_560);
  iVar7 = local_5d8[0];
  local_5d8[0] = local_5d8[0] + 1;
  _::Mutex::unlock((Mutex *)((long)&local_5f1[0]._vptr_Iface + 1),EXCLUSIVE,(Waiter *)0x0);
  local_3b8._vptr_Disposer._0_4_ = iVar7;
  local_560._0_8_ = &local_3b8;
  local_560._8_4_ = 100;
  local_550 = (Disposer *)0x1c31cf;
  local_548 = &DAT_00000005;
  local_540 = iVar7 == 100;
  if ((!local_540) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x13d,ERROR,"\"failed: expected \" \"m == 100\", _kjCondition",
               (char (*) [26])"failed: expected m == 100",
               (DebugComparison<unsigned_int_&,_int> *)local_560);
  }
  local_1e8 = (Mutex *)((ulong)local_1e8 & 0xffffffffffffff00);
  _::Mutex::lock((Mutex *)((long)&local_5f1[0]._vptr_Iface + 1),1);
  local_540 = local_5d8[0] == 0x65;
  local_560._0_8_ = local_5d8;
  local_560._8_4_ = 0x65;
  local_550 = (Disposer *)0x1c31cf;
  local_548 = &DAT_00000005;
  _::Mutex::unlock((Mutex *)((long)&local_5f1[0]._vptr_Iface + 1),SHARED,(Waiter *)0x0);
  if ((local_540 == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[44],kj::_::DebugComparison<unsigned_int_const&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x13f,ERROR,"\"failed: expected \" \"*value.lockShared() == 101\", _kjCondition",
               (char (*) [44])"failed: expected *value.lockShared() == 101",
               (DebugComparison<const_unsigned_int_&,_int> *)local_560);
  }
  if (firstElement != (ThreadState *)0x0) {
    _::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&_::HeapArrayDisposer::instance,firstElement,0x10,lVar6 >> 4,100
               ,ArrayDisposer::Dispose_<kj::Own<kj::Thread,_std::nullptr_t>_>::destruct);
  }
  lVar6 = (*(code *)**(undefined8 **)local_5c8)();
  local_560._0_8_ = local_560._0_8_ & 0xffffffffffffff00;
  puVar2 = (undefined1 *)((long)&local_5f1[0]._vptr_Iface + 1);
  _::Mutex::lock((Mutex *)puVar2,0);
  local_380._8_8_ = 10000000;
  local_560._0_8_ = &PTR_check_002262b8;
  local_560._8_8_ = &local_5c0;
  local_380[0] = 1;
  local_550 = (Disposer *)local_5d8;
  local_1e8 = (Mutex *)puVar2;
  local_1e0 = (Disposer *)local_5d8;
  _::Mutex::wait((Mutex *)puVar2,(DebugComparison<unsigned_int_&,_int> *)local_560);
  local_540 = local_5d8[0] == 0x65;
  local_560._8_4_ = 0x65;
  local_550 = (Disposer *)0x1c31cf;
  local_548 = &DAT_00000005;
  local_560._0_8_ = local_5d8;
  if (local_540) {
    lVar5 = (*(code *)**(undefined8 **)local_5c8)();
    local_380._0_8_ = lVar5 - lVar6;
    local_540 = 9999999 < (long)local_380._0_8_;
    local_560._8_8_ = (Iface *)0x989680;
    local_550 = (Disposer *)0x1e01ed;
    local_548 = &DAT_00000005;
    local_560._0_8_ = (Disposer *)local_380;
    if (((long)local_380._0_8_ < 10000000) && (_::Debug::minSeverity < 3)) {
      _::Debug::
      log<char_const(&)[44],kj::_::DebugComparison<kj::Quantity<long,kj::_::NanosecondLabel>&,kj::Quantity<long,kj::_::NanosecondLabel>>&,kj::Quantity<long,kj::_::NanosecondLabel>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x147,ERROR,
                 "\"failed: expected \" \"t >= 10 * kj::MILLISECONDS\", _kjCondition, t",
                 (char (*) [44])"failed: expected t >= 10 * kj::MILLISECONDS",
                 (DebugComparison<kj::Quantity<long,_kj::_::NanosecondLabel>_&,_kj::Quantity<long,_kj::_::NanosecondLabel>_>
                  *)local_560,(Quantity<long,_kj::_::NanosecondLabel> *)local_380);
    }
    _::Mutex::unlock((Mutex *)((long)&local_5f1[0]._vptr_Iface + 1),EXCLUSIVE,(Waiter *)0x0);
    local_560._0_8_ = local_560._0_8_ & 0xffffffffffffff00;
    puVar2 = (undefined1 *)((long)&local_5f1[0]._vptr_Iface + 1);
    _::Mutex::lock((Mutex *)puVar2,0);
    local_380._8_8_ = 10000000;
    local_560._0_8_ = &PTR_check_002262e8;
    local_560._8_8_ = &local_5c0;
    local_380[0] = 1;
    local_550 = (Disposer *)local_5d8;
    local_1e8 = (Mutex *)puVar2;
    local_1e0 = (Disposer *)local_5d8;
    _::Mutex::wait((Mutex *)puVar2,(DebugComparison<unsigned_int_&,_int> *)local_560);
    local_540 = local_5d8[0] == 0x65;
    local_560._8_4_ = 0x65;
    local_550 = (Disposer *)0x1c31cf;
    local_548 = &DAT_00000005;
    local_560._0_8_ = local_5d8;
    if (local_540) {
      lVar5 = (*(code *)**(undefined8 **)local_5c8)();
      local_380._0_8_ = lVar5 - lVar6;
      local_540 = 19999999 < (long)local_380._0_8_;
      local_560._8_8_ = (Iface *)0x1312d00;
      local_550 = (Disposer *)0x1e01ed;
      local_548 = &DAT_00000005;
      local_560._0_8_ = (Disposer *)local_380;
      if (((long)local_380._0_8_ < 20000000) && (_::Debug::minSeverity < 3)) {
        _::Debug::
        log<char_const(&)[44],kj::_::DebugComparison<kj::Quantity<long,kj::_::NanosecondLabel>&,kj::Quantity<long,kj::_::NanosecondLabel>>&,kj::Quantity<long,kj::_::NanosecondLabel>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                   ,0x14f,ERROR,
                   "\"failed: expected \" \"t >= 20 * kj::MILLISECONDS\", _kjCondition, t",
                   (char (*) [44])"failed: expected t >= 20 * kj::MILLISECONDS",
                   (DebugComparison<kj::Quantity<long,_kj::_::NanosecondLabel>_&,_kj::Quantity<long,_kj::_::NanosecondLabel>_>
                    *)local_560,(Quantity<long,_kj::_::NanosecondLabel> *)local_380);
      }
      _::Mutex::unlock((Mutex *)((long)&local_5f1[0]._vptr_Iface + 1),EXCLUSIVE,(Waiter *)0x0);
      local_560._0_8_ = local_560._0_8_ & 0xffffffffffffff00;
      puVar2 = (undefined1 *)((long)&local_5f1[0]._vptr_Iface + 1);
      _::Mutex::lock((Mutex *)puVar2,0);
      local_380._8_8_ = 10000000000;
      local_560._0_8_ = &PTR_check_00226318;
      local_560._8_8_ = &local_5c0;
      local_380[0] = 1;
      local_550 = (Disposer *)local_5d8;
      local_1e8 = (Mutex *)puVar2;
      local_1e0 = (Disposer *)local_5d8;
      _::Mutex::wait((Mutex *)puVar2,(DebugComparison<unsigned_int_&,_int> *)local_560);
      local_540 = local_5d8[0] == 0x65;
      local_560._8_4_ = 0x65;
      local_550 = (Disposer *)0x1c31cf;
      local_548 = &DAT_00000005;
      if (local_540) {
        local_560._0_8_ = local_5d8;
        _::Mutex::unlock((Mutex *)((long)&local_5f1[0]._vptr_Iface + 1),EXCLUSIVE,(Waiter *)0x0);
        local_3b8._vptr_Disposer = local_3b8._vptr_Disposer & 0xffffffffffffff00;
        puVar2 = (undefined1 *)((long)&local_5f1[0]._vptr_Iface + 1);
        _::Mutex::lock((Mutex *)puVar2,0);
        local_48 = 10000000000;
        local_3b8._vptr_Disposer = (_func_int **)&PTR_check_00226348;
        local_3b0 = (long)&local_5ca;
        local_50 = 1;
        local_3a8 = (Disposer *)local_5d8;
        local_3a0 = (Mutex *)puVar2;
        local_398 = (Disposer *)local_5d8;
        _::Mutex::wait((Mutex *)puVar2,&local_3b8);
        if (_::Debug::minSeverity < 3) {
          _::Debug::log<char_const(&)[19]>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                     ,0x160,ERROR,"\"shouldn\'t get here\"",(char (*) [19])"shouldn\'t get here");
        }
        _::Mutex::unlock((Mutex *)((long)&local_5f1[0]._vptr_Iface + 1),EXCLUSIVE,(Waiter *)0x0);
        local_560._0_8_ = local_560._0_8_ & 0xffffffffffffff00;
        if (_::Debug::minSeverity < 3) {
          _::Debug::log<char_const(&)[154]>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                     ,0x161,ERROR,
                     "\"code did not throw: \" \"value.when([](uint n) -> bool { KJ_FAIL_ASSERT(\\\"oops threw\\\"); }, [](uint& n) { KJ_FAIL_EXPECT(\\\"shouldn\'t get here\\\"); }, LONG_TIMEOUT)\""
                     ,(char (*) [154])
                      "code did not throw: value.when([](uint n) -> bool { KJ_FAIL_ASSERT(\"oops threw\"); }, [](uint& n) { KJ_FAIL_EXPECT(\"shouldn\'t get here\"); }, LONG_TIMEOUT)"
                    );
        }
        if (local_560[0] == '\x01') {
          Exception::~Exception((Exception *)(local_560 + 8));
        }
        local_598.impl.ptr = (Iface *)operator_new(0x10);
        (local_598.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00226378;
        local_598.impl.ptr[1]._vptr_Iface = (_func_int **)puVar2;
        local_598.impl.disposer =
             (Disposer *)
             &_::
              HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::TestCase268::run()::$_15>>
              ::instance;
        Thread::Thread(&local_578,&local_598);
        pIVar3 = local_598.impl.ptr;
        if (local_598.impl.ptr != (Iface *)0x0) {
          local_598.impl.ptr = (Iface *)0x0;
          (**(local_598.impl.disposer)->_vptr_Disposer)
                    (local_598.impl.disposer,
                     (_func_int *)((long)&pIVar3->_vptr_Iface + (long)pIVar3->_vptr_Iface[-2]));
        }
        local_5c0._vptr_Disposer = local_5c0._vptr_Disposer & 0xffffffffffffff00;
        puVar2 = (undefined1 *)((long)&local_5f1[0]._vptr_Iface + 1);
        _::Mutex::lock((Mutex *)puVar2,0);
        local_38 = 10000000000;
        local_5c0._vptr_Disposer = (_func_int **)&PTR_check_002263e0;
        local_5b8 = (Disposer *)&local_5c9;
        local_40 = 1;
        local_5b0 = (Disposer *)local_5d8;
        local_390 = (Mutex *)puVar2;
        local_388 = (Disposer *)local_5d8;
        _::Mutex::wait((Mutex *)puVar2,&local_5c0);
        if (_::Debug::minSeverity < 3) {
          _::Debug::log<char_const(&)[19]>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                     ,0x16d,ERROR,"\"shouldn\'t get here\"",(char (*) [19])"shouldn\'t get here");
        }
        _::Mutex::unlock((Mutex *)((long)&local_5f1[0]._vptr_Iface + 1),EXCLUSIVE,(Waiter *)0x0);
        local_560._0_8_ = local_560._0_8_ & 0xffffffffffffff00;
        if (_::Debug::minSeverity < 3) {
          _::Debug::log<char_const(&)[173]>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                     ,0x16e,ERROR,
                     "\"code did not throw: \" \"value.when([](uint n) -> bool { KJ_ASSERT(n != 321, \\\"oops threw\\\"); return false; }, [](uint& n) { KJ_FAIL_EXPECT(\\\"shouldn\'t get here\\\"); }, LONG_TIMEOUT)\""
                     ,(char (*) [173])
                      "code did not throw: value.when([](uint n) -> bool { KJ_ASSERT(n != 321, \"oops threw\"); return false; }, [](uint& n) { KJ_FAIL_EXPECT(\"shouldn\'t get here\"); }, LONG_TIMEOUT)"
                    );
        }
        if (local_560[0] == '\x01') {
          Exception::~Exception((Exception *)(local_560 + 8));
        }
        Thread::~Thread(&local_578);
        local_560._0_8_ = local_560._0_8_ & 0xffffffffffffff00;
        puVar2 = (undefined1 *)((long)&local_5f1[0]._vptr_Iface + 1);
        _::Mutex::lock((Mutex *)puVar2,0);
        local_380._8_8_ = 10000000000;
        local_560._0_8_ = &PTR_check_00226410;
        local_380[0] = 1;
        local_560._8_8_ = &local_578;
        local_550 = (Disposer *)local_5d8;
        local_1e8 = (Mutex *)puVar2;
        local_1e0 = (Disposer *)local_5d8;
        _::Mutex::wait((Mutex *)puVar2,local_560);
        iVar7 = local_5d8[0];
        _::Mutex::unlock((Mutex *)((long)&local_5f1[0]._vptr_Iface + 1),EXCLUSIVE,(Waiter *)0x0);
        local_3c8[0]._vptr_Disposer._0_4_ = iVar7;
        local_560._8_4_ = 0x141;
        local_550 = (Disposer *)0x1c31cf;
        local_548 = &DAT_00000005;
        local_540 = iVar7 == 0x141;
        local_560._0_8_ = local_3c8;
        if ((!local_540) && (_::Debug::minSeverity < 3)) {
          _::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                     ,0x176,ERROR,"\"failed: expected \" \"m == 321\", _kjCondition",
                     (char (*) [26])"failed: expected m == 321",
                     (DebugComparison<unsigned_int_&,_int> *)local_560);
        }
        lVar6 = (*(code *)**(undefined8 **)local_5c8)();
        local_560._0_8_ = local_560._0_8_ & 0xffffffffffffff00;
        puVar2 = (undefined1 *)((long)&local_5f1[0]._vptr_Iface + 1);
        _::Mutex::lock((Mutex *)puVar2,0);
        local_550 = (Disposer *)local_5d8;
        local_380._8_8_ = 10000000;
        local_560._0_8_ = &PTR_check_00226440;
        local_380[0] = 1;
        local_560._8_8_ = &local_578;
        local_1e8 = (Mutex *)puVar2;
        local_1e0 = local_550;
        _::Mutex::wait((Mutex *)puVar2,local_560);
        lVar5 = (*(code *)**(undefined8 **)local_5c8)();
        local_560._0_8_ = lVar5 - lVar6;
        local_540 = 9999999 < (long)local_560._0_8_;
        local_560._8_8_ = (Iface *)0x989680;
        local_550 = (Disposer *)0x1e01ed;
        local_548 = &DAT_00000005;
        if (((long)local_560._0_8_ < 10000000) && (_::Debug::minSeverity < 3)) {
          _::Debug::
          log<char_const(&)[62],kj::_::DebugComparison<kj::Quantity<long,kj::_::NanosecondLabel>,kj::Quantity<long,kj::_::NanosecondLabel>>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                     ,0x17a,ERROR,
                     "\"failed: expected \" \"clock.now() - start >= 10 * kj::MILLISECONDS\", _kjCondition"
                     ,(char (*) [62])"failed: expected clock.now() - start >= 10 * kj::MILLISECONDS"
                     ,(DebugComparison<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::Quantity<long,_kj::_::NanosecondLabel>_>
                       *)local_560);
        }
        iVar7 = local_5d8[0];
        puVar2 = (undefined1 *)((long)&local_5f1[0]._vptr_Iface + 1);
        _::Mutex::unlock((Mutex *)puVar2,EXCLUSIVE,(Waiter *)0x0);
        local_3c8[0]._vptr_Disposer._0_4_ = iVar7 + 1;
        local_560._8_4_ = 0x142;
        local_550 = (Disposer *)0x1c31cf;
        local_548 = &DAT_00000005;
        local_540 = (int)local_3c8[0]._vptr_Disposer == 0x142;
        local_560._0_8_ = local_3c8;
        if ((!local_540) && (_::Debug::minSeverity < 3)) {
          _::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                     ,0x17d,ERROR,"\"failed: expected \" \"m == 322\", _kjCondition",
                     (char (*) [26])"failed: expected m == 322",
                     (DebugComparison<unsigned_int_&,_int> *)local_560);
        }
        local_5a8.impl.ptr = (Iface *)operator_new(0x10);
        (local_5a8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00226470;
        local_5a8.impl.ptr[1]._vptr_Iface = (_func_int **)puVar2;
        local_5a8.impl.disposer =
             (Disposer *)
             &_::
              HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::TestCase268::run()::$_21>>
              ::instance;
        Thread::Thread((Thread *)local_380,&local_5a8);
        pIVar3 = local_5a8.impl.ptr;
        if (local_5a8.impl.ptr != (Iface *)0x0) {
          local_5a8.impl.ptr = (Iface *)0x0;
          (**(local_5a8.impl.disposer)->_vptr_Disposer)
                    (local_5a8.impl.disposer,pIVar3->_vptr_Iface[-2] + (long)pIVar3);
        }
        local_560._0_8_ = local_560._0_8_ & 0xffffffffffffff00;
        puVar2 = (undefined1 *)((long)&local_5f1[0]._vptr_Iface + 1);
        _::Mutex::lock((Mutex *)puVar2,0);
        local_578.threadId = (unsigned_long_long)local_5d8;
        local_1e0 = (Disposer *)0x2540be400;
        local_560._0_8_ = &PTR_check_002264d8;
        local_560._8_8_ = local_5f1;
        local_1e8 = (Mutex *)CONCAT71(local_1e8._1_7_,1);
        local_578.state = (ThreadState *)puVar2;
        local_550 = (Disposer *)local_578.threadId;
        _::Mutex::wait((Mutex *)puVar2,local_560);
        iVar7 = local_5d8[0];
        _::Mutex::unlock((Mutex *)((long)&local_5f1[0]._vptr_Iface + 1),EXCLUSIVE,(Waiter *)0x0);
        local_3c8[0]._vptr_Disposer._0_4_ = iVar7;
        local_560._8_4_ = 0x28e;
        local_550 = (Disposer *)0x1c31cf;
        local_548 = &DAT_00000005;
        local_540 = iVar7 == 0x28e;
        local_560._0_8_ = local_3c8;
        if ((!local_540) && (_::Debug::minSeverity < 3)) {
          _::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                     ,0x187,ERROR,"\"failed: expected \" \"m == 654\", _kjCondition",
                     (char (*) [26])"failed: expected m == 654",
                     (DebugComparison<unsigned_int_&,_int> *)local_560);
        }
        Thread::~Thread((Thread *)local_380);
        _::Mutex::~Mutex((Mutex *)((long)&local_5f1[0]._vptr_Iface + 1));
        return;
      }
      local_560._0_8_ = local_5d8;
      _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&>
                ((Fault *)local_380,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x155,FAILED,"n == 101","_kjCondition,",
                 (DebugComparison<unsigned_int_&,_int> *)local_560);
      _::Debug::Fault::fatal((Fault *)local_380);
    }
    _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&>
              ((Fault *)local_380,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x14d,FAILED,"n == 101","_kjCondition,",
               (DebugComparison<unsigned_int_&,_int> *)local_560);
    _::Debug::Fault::fatal((Fault *)local_380);
  }
  _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&>
            ((Fault *)local_380,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
             ,0x145,FAILED,"n == 101","_kjCondition,",
             (DebugComparison<unsigned_int_&,_int> *)local_560);
  _::Debug::Fault::fatal((Fault *)local_380);
}

Assistant:

TEST(Mutex, WhenWithTimeout) {
  auto& clock = systemPreciseMonotonicClock();
  MutexGuarded<uint> value(123);

  // A timeout that won't expire.
  static constexpr Duration LONG_TIMEOUT = 10 * kj::SECONDS;

  {
    uint m = value.when([](uint n) { return n < 200; }, [](uint& n) {
      ++n;
      return n + 2;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 126);

    KJ_EXPECT(*value.lockShared() == 124);
  }

  {
    kj::Thread thread([&]() {
      delay();
      *value.lockExclusive() = 321;
    });

    uint m = value.when([](uint n) { return n > 200; }, [](uint& n) {
      ++n;
      return n + 2;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 324);

    KJ_EXPECT(*value.lockShared() == 322);
  }

  {
    // Stress test. 100 threads each wait for a value and then set the next value.
    *value.lockExclusive() = 0;

    auto threads = kj::heapArrayBuilder<kj::Own<kj::Thread>>(100);
    for (auto i: kj::zeroTo(100)) {
      threads.add(kj::heap<kj::Thread>([i,&value]() {
        if (i % 2 == 0) delay();
        uint m = value.when([i](const uint& n) { return n == i; },
            [](uint& n) { return n++; }, LONG_TIMEOUT);
        KJ_ASSERT(m == i);
      }));
    }

    uint m = value.when([](uint n) { return n == 100; }, [](uint& n) {
      return n++;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 100);

    KJ_EXPECT(*value.lockShared() == 101);
  }

  {
    auto start = clock.now();
    uint m = value.when([](uint n) { return n == 0; }, [&](uint& n) {
      KJ_ASSERT(n == 101);
      auto t = clock.now() - start;
      KJ_EXPECT(t >= 10 * kj::MILLISECONDS, t);
      return 12;
    }, 10 * kj::MILLISECONDS);
    KJ_EXPECT(m == 12);

    m = value.when([](uint n) { return n == 0; }, [&](uint& n) {
      KJ_ASSERT(n == 101);
      auto t = clock.now() - start;
      KJ_EXPECT(t >= 20 * kj::MILLISECONDS, t);
      return 34;
    }, 10 * kj::MILLISECONDS);
    KJ_EXPECT(m == 34);

    m = value.when([](uint n) { return n > 0; }, [&](uint& n) {
      KJ_ASSERT(n == 101);
      return 56;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 56);
  }

  {
    // Throw from predicate.
    KJ_EXPECT_THROW_MESSAGE("oops threw", value.when([](uint n) -> bool {
      KJ_FAIL_ASSERT("oops threw");
    }, [](uint& n) {
      KJ_FAIL_EXPECT("shouldn't get here");
    }, LONG_TIMEOUT));

    // Throw from predicate later on.
    kj::Thread thread([&]() {
      delay();
      *value.lockExclusive() = 321;
    });

    KJ_EXPECT_THROW_MESSAGE("oops threw", value.when([](uint n) -> bool {
      KJ_ASSERT(n != 321, "oops threw");
      return false;
    }, [](uint& n) {
      KJ_FAIL_EXPECT("shouldn't get here");
    }, LONG_TIMEOUT));
  }

  {
    // Verify the exceptions didn't break the mutex.
    uint m = value.when([](uint n) { return n > 0; }, [](uint& n) {
      return n;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 321);

    auto start = clock.now();
    m = value.when([](uint n) { return n == 0; }, [&](uint& n) {
      KJ_EXPECT(clock.now() - start >= 10 * kj::MILLISECONDS);
      return n + 1;
    }, 10 * kj::MILLISECONDS);
    KJ_EXPECT(m == 322);

    kj::Thread thread([&]() {
      delay();
      *value.lockExclusive() = 654;
    });

    m = value.when([](uint n) { return n > 500; }, [](uint& n) {
      return n;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 654);
  }
}